

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PopulationDirector.cpp
# Opt level: O2

shared_ptr<Population> __thiscall
PopulationDirector::makeAverage(PopulationDirector *this,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TypeName TVar2;
  int32_t iVar3;
  RandomGenerator *pRVar4;
  Config *pCVar5;
  pair<int,_int> pVar6;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar7;
  shared_ptr<Population> sVar8;
  Population *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string local_48 [32];
  
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  std::__cxx11::string::string(local_48,in_RDX);
  (**(code **)(*plVar7 + 8))(plVar7,local_48);
  std::__cxx11::string::~string(local_48);
  (*(code *)**(undefined8 **)(name->_M_dataplus)._M_p)();
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x58))(&local_58);
  TVar2 = Population::GetType(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  pRVar4 = RandomGenerator::getInstance();
  pCVar5 = Config::getInstance();
  if (TVar2 == HERBIVORE) {
    pVar6 = Config::getHerbivoreAverageAnimalAmount(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x10))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getHerbivoreAverageHealth(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x18))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getHerbivoreAverageProductivity(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x20))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getHerbivoreAverageBiologyDev(pCVar5);
  }
  else {
    pVar6 = Config::getCarnivoreAverageAnimalAmount(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x10))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getCarnivoreAverageHealth(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x18))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getCarnivoreAverageProductivity(pCVar5);
    iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
    (**(code **)(*plVar7 + 0x20))(plVar7,iVar3);
    plVar7 = (long *)(name->_M_dataplus)._M_p;
    pRVar4 = RandomGenerator::getInstance();
    pCVar5 = Config::getInstance();
    pVar6 = Config::getCarnivoreAverageBiologyDev(pCVar5);
  }
  iVar3 = RandomGenerator::randNormalInt(pRVar4,pVar6);
  (**(code **)(*plVar7 + 0x28))(plVar7,iVar3);
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar7 + 0x30))(plVar7,2);
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar7 + 0x38))(plVar7,2);
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar7 + 0x40))(plVar7,2);
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar7 + 0x48))(plVar7,2);
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x58))(&local_58);
  _Var1._M_pi = _Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->builder).super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58;
  (this->builder).super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  local_58 = (Population *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x50))();
  sVar8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Population>)sVar8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Population> PopulationDirector::makeAverage(const std::string &name) {
  builder->setName(name);
  builder->setType();
  if (builder->getProduct()->GetType() == Population::TypeName::HERBIVORE) {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  } else {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  }
  auto oldPtr = std::move(builder -> getProduct());
  builder -> resetPopulation();

  return oldPtr;
}